

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_track.cpp
# Opt level: O0

void __thiscall cp::CoMTrack::calcRefZMP(CoMTrack *this,Vector2 *end_cp)

{
  double this_00;
  double local_f8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_f0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_c8;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_90;
  Matrix<double,_2,_1,_0,_2,_1> local_38;
  double local_20;
  double b;
  Vector2 *end_cp_local;
  CoMTrack *this_local;
  
  b = (double)end_cp;
  end_cp_local = (Vector2 *)this;
  setStepVariable(this);
  local_20 = exp(*(double *)(this + 0x28) * *(double *)(this + 0x30));
  calcCPTrack((CoMTrack *)&local_38,*(double *)(this + 0x30));
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::operator=
            ((Matrix<double,_2,_1,_0,_2,_1> *)(this + 0x60),&local_38);
  this_00 = b;
  Eigen::operator*(&local_f0,&local_20,(StorageBaseType *)(this + 0x60));
  Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator-
            (&local_c8,(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)this_00,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)&local_f0);
  local_f8 = 1.0 - local_20;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>>
  ::operator/(&local_90,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Matrix<double,2,1,0,2,1>const>const>>
               *)&local_c8,&local_f8);
  Eigen::Matrix<double,2,1,0,2,1>::operator=
            ((Matrix<double,2,1,0,2,1> *)(this + 0x70),
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
              *)&local_90);
  return;
}

Assistant:

void CoMTrack::calcRefZMP(const Vector2& end_cp) {
  setStepVariable();
  double b = exp(w * st_s);
  now_cp = calcCPTrack(st_s);
  ref_zmp = (end_cp - b * now_cp) / (1 - b);
}